

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O1

void __thiscall
FBaseCVar::ForceSet(FBaseCVar *this,UCVarValue value,ECVarType type,bool nouserinfosend)

{
  (*this->_vptr_FBaseCVar[9])();
  if ((this->Flags & 0x4002) == 2 && !nouserinfosend) {
    D_UserInfoChanged(this);
  }
  if ((m_UseCallback == true) && (this->m_Callback != (_func_void_FBaseCVar_ptr *)0x0)) {
    (*this->m_Callback)(this);
  }
  *(byte *)&this->Flags = (byte)this->Flags & 0x7f;
  return;
}

Assistant:

void FBaseCVar::ForceSet (UCVarValue value, ECVarType type, bool nouserinfosend)
{
	DoSet (value, type);
	if ((Flags & CVAR_USERINFO) && !nouserinfosend && !(Flags & CVAR_IGNORE))
		D_UserInfoChanged (this);
	if (m_UseCallback)
		Callback ();

	Flags &= ~CVAR_ISDEFAULT;
}